

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_imply_non_tet(REF_DBL *metric,REF_GRID ref_grid)

{
  REF_DBL *pRVar1;
  double dVar2;
  double dVar3;
  REF_NODE ref_node;
  REF_ADJ pRVar4;
  REF_CELL pRVar5;
  REF_STATUS RVar6;
  uint uVar7;
  void *__ptr;
  REF_DBL *pRVar8;
  long lVar9;
  REF_DBL *pRVar10;
  void *pvVar11;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  int iVar17;
  double dVar18;
  double dVar19;
  REF_DBL log_m [6];
  REF_DBL m [6];
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  uVar13 = (ulong)(uint)ref_node->max;
  if (ref_node->max < 0) {
    pcVar16 = "malloc backup of REF_DBL negative";
    uVar12 = 0x696;
LAB_0019afc9:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar12
           ,"ref_metric_imply_non_tet",pcVar16);
    uVar7 = 1;
  }
  else {
    __ptr = malloc(uVar13 * 0x30);
    uVar7 = 2;
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x696,"ref_metric_imply_non_tet","malloc backup of REF_DBL NULL");
    }
    else {
      pRVar8 = metric;
      pvVar11 = __ptr;
      for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
        if (-1 < ref_node->global[uVar15]) {
          for (lVar14 = 0; lVar14 != 6; lVar14 = lVar14 + 1) {
            *(REF_DBL *)((long)pvVar11 + lVar14 * 8) = pRVar8[lVar14];
          }
        }
        pvVar11 = (void *)((long)pvVar11 + 0x30);
        pRVar8 = pRVar8 + 6;
      }
      pRVar8 = (REF_DBL *)malloc(uVar13 * 8);
      if (pRVar8 == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x69b,"ref_metric_imply_non_tet","malloc total_node_volume of REF_DBL NULL");
      }
      else {
        for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
          pRVar8[uVar15] = 0.0;
        }
        pRVar10 = metric;
        for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
          if ((-1 < ref_node->global[uVar15]) &&
             ((((pRVar4 = ref_grid->cell[9]->ref_adj, (long)uVar15 < (long)pRVar4->nnode &&
                (pRVar4->first[uVar15] != -1)) ||
               ((pRVar4 = ref_grid->cell[10]->ref_adj, (long)uVar15 < (long)pRVar4->nnode &&
                (pRVar4->first[uVar15] != -1)))) ||
              ((pRVar4 = ref_grid->cell[0xb]->ref_adj, (long)uVar15 < (long)pRVar4->nnode &&
               (pRVar4->first[uVar15] != -1)))))) {
            for (lVar14 = 0; lVar14 != 6; lVar14 = lVar14 + 1) {
              pRVar10[lVar14] = 0.0;
            }
          }
          pRVar10 = pRVar10 + 6;
        }
        pRVar5 = ref_grid->cell[10];
        for (iVar17 = 0; iVar17 < pRVar5->max; iVar17 = iVar17 + 1) {
          RVar6 = ref_cell_nodes(pRVar5,iVar17,nodes);
          if (RVar6 == 0) {
            uVar7 = add_sub_tet(0,4,5,3,nodes,metric,pRVar8,ref_node,pRVar5);
            if (uVar7 != 0) {
              pcVar16 = "pri sub tet";
              uVar12 = 0x6ae;
              goto LAB_0019b4ae;
            }
            uVar7 = add_sub_tet(0,1,5,4,nodes,metric,pRVar8,ref_node,pRVar5);
            if (uVar7 != 0) {
              pcVar16 = "pri sub tet";
              uVar12 = 0x6b1;
              goto LAB_0019b4ae;
            }
            uVar7 = add_sub_tet(0,1,2,5,nodes,metric,pRVar8,ref_node,pRVar5);
            if (uVar7 != 0) {
              pcVar16 = "pri sub tet";
              uVar12 = 0x6b4;
              goto LAB_0019b4ae;
            }
          }
        }
        pRVar5 = ref_grid->cell[9];
        for (iVar17 = 0; iVar17 < pRVar5->max; iVar17 = iVar17 + 1) {
          RVar6 = ref_cell_nodes(pRVar5,iVar17,nodes);
          if (RVar6 == 0) {
            uVar7 = add_sub_tet(0,4,1,2,nodes,metric,pRVar8,ref_node,pRVar5);
            if (uVar7 != 0) {
              pcVar16 = "pyr sub tet";
              uVar12 = 0x6bb;
              goto LAB_0019b4ae;
            }
            uVar7 = add_sub_tet(0,3,4,2,nodes,metric,pRVar8,ref_node,pRVar5);
            if (uVar7 != 0) {
              pcVar16 = "pyr sub tet";
              uVar12 = 0x6be;
              goto LAB_0019b4ae;
            }
          }
        }
        pRVar5 = ref_grid->cell[0xb];
        for (iVar17 = 0; iVar17 < pRVar5->max; iVar17 = iVar17 + 1) {
          RVar6 = ref_cell_nodes(pRVar5,iVar17,nodes);
          if (RVar6 == 0) {
            uVar7 = add_sub_tet(0,5,7,4,nodes,metric,pRVar8,ref_node,pRVar5);
            if (uVar7 != 0) {
              uVar12 = 0x6ca;
LAB_0019b803:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,uVar12,"ref_metric_imply_non_tet",(ulong)uVar7,"hex sub tet");
              return uVar7;
            }
            uVar7 = add_sub_tet(0,1,7,5,nodes,metric,pRVar8,ref_node,pRVar5);
            if (uVar7 != 0) {
              uVar12 = 0x6cd;
              goto LAB_0019b803;
            }
            uVar7 = add_sub_tet(1,6,7,5,nodes,metric,pRVar8,ref_node,pRVar5);
            if (uVar7 != 0) {
              uVar12 = 0x6d0;
              goto LAB_0019b803;
            }
            uVar7 = add_sub_tet(0,7,2,3,nodes,metric,pRVar8,ref_node,pRVar5);
            if (uVar7 != 0) {
              uVar12 = 0x6d4;
              goto LAB_0019b803;
            }
            uVar7 = add_sub_tet(0,7,1,2,nodes,metric,pRVar8,ref_node,pRVar5);
            if (uVar7 != 0) {
              uVar12 = 0x6d7;
              goto LAB_0019b803;
            }
            uVar7 = add_sub_tet(1,7,6,2,nodes,metric,pRVar8,ref_node,pRVar5);
            if (uVar7 != 0) {
              uVar12 = 0x6da;
              goto LAB_0019b803;
            }
          }
        }
        lVar14 = 0;
        pRVar10 = metric;
        pvVar11 = __ptr;
        while( true ) {
          if (ref_node->max <= lVar14) break;
          if (-1 < ref_node->global[lVar14]) {
            pRVar4 = ref_grid->cell[9]->ref_adj;
            if ((((lVar14 < pRVar4->nnode) && (pRVar4->first[lVar14] != -1)) ||
                ((pRVar4 = ref_grid->cell[10]->ref_adj, lVar14 < pRVar4->nnode &&
                 (pRVar4->first[lVar14] != -1)))) ||
               ((pRVar4 = ref_grid->cell[0xb]->ref_adj, lVar14 < pRVar4->nnode &&
                (pRVar4->first[lVar14] != -1)))) {
              if (ref_node->ref_mpi->id == ref_node->part[lVar14]) {
                dVar2 = pRVar8[lVar14];
                if (dVar2 <= 0.0) {
                  for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
                    pRVar10[lVar9] = *(REF_DBL *)((long)pvVar11 + lVar9 * 8);
                  }
                  lVar9 = 0;
                  while (lVar9 != 6) {
                    pRVar1 = pRVar10 + lVar9;
                    lVar9 = lVar9 + 1;
                    if (0x7fefffffffffffff < (ulong)ABS(*pRVar1)) {
                      pcVar16 = "backup not finite";
                      uVar12 = 0x6f5;
                      goto LAB_0019afc9;
                    }
                  }
                }
                else {
                  dVar18 = dVar2 * 1e+20;
                  if (dVar18 <= -dVar18) {
                    dVar18 = -dVar18;
                  }
                  for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
                    dVar3 = pRVar10[lVar9];
                    dVar19 = dVar3;
                    if (dVar3 <= -dVar3) {
                      dVar19 = -dVar3;
                    }
                    if (dVar18 <= dVar19) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x6e9,"ref_metric_imply_non_tet",4,"zero volume");
                      return 4;
                    }
                    log_m[lVar9] = dVar3 / dVar2;
                  }
                  uVar7 = ref_matrix_exp_m(log_m,m);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x6ec,"ref_metric_imply_non_tet",(ulong)uVar7,"exp");
                    return uVar7;
                  }
                  for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
                    pRVar10[lVar9] = m[lVar9];
                  }
                  pRVar8[lVar14] = 0.0;
                  lVar9 = 0;
                  while (lVar9 != 6) {
                    pRVar1 = pRVar10 + lVar9;
                    lVar9 = lVar9 + 1;
                    if (0x7fefffffffffffff < (ulong)ABS(*pRVar1)) {
                      pcVar16 = "infer not finite";
                      uVar12 = 0x6f0;
                      goto LAB_0019afc9;
                    }
                  }
                }
              }
            }
            else {
              lVar9 = 0;
              while (lVar9 != 6) {
                pRVar1 = pRVar10 + lVar9;
                lVar9 = lVar9 + 1;
                if (0x7fefffffffffffff < (ulong)ABS(*pRVar1)) {
                  pcVar16 = "orig,tet not finite";
                  uVar12 = 0x6fa;
                  goto LAB_0019afc9;
                }
              }
            }
          }
          lVar14 = lVar14 + 1;
          pRVar10 = pRVar10 + 6;
          pvVar11 = (void *)((long)pvVar11 + 0x30);
        }
        free(pRVar8);
        free(__ptr);
        uVar7 = ref_node_ghost_dbl(ref_node,metric,6);
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          pcVar16 = "update ghosts";
          uVar12 = 0x701;
LAB_0019b4ae:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar12,"ref_metric_imply_non_tet",(ulong)uVar7,pcVar16);
        }
      }
    }
  }
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_metric_imply_non_tet(REF_DBL *metric,
                                            REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *total_node_volume;
  REF_DBL m[6], log_m[6];
  REF_INT node, im;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL *backup;

  ref_malloc(backup, 6 * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (im = 0; im < 6; im++) backup[im + 6 * node] = metric[im + 6 * node];
  }

  ref_malloc_init(total_node_volume, ref_node_max(ref_node), REF_DBL, 0.0);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pyr(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pri(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_hex(ref_grid)), node))) {
      for (im = 0; im < 6; im++) {
        metric[im + 6 * node] = 0.0;
      }
    }
  }

  ref_cell = ref_grid_pri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 5, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 5, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 2, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
  }

  ref_cell = ref_grid_pyr(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
    RSS(add_sub_tet(0, 3, 4, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
  }

  /*
VI1 VI6 VI8 VI5  VI1 VI2 VI8 VI6  VI2 VI7 VI8 VI6
VI1 VI8 VI3 VI4  VI1 VI8 VI2 VI3  VI2 VI8 VI7 VI3
  */

  ref_cell = ref_grid_hex(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 5, 7, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 1, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 6, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");

    RSS(add_sub_tet(0, 7, 2, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 7, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 7, 6, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pyr(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pri(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_hex(ref_grid)), node))) {
      if (ref_node_owned(ref_node, node)) {
        if (0.0 < total_node_volume[node]) {
          for (im = 0; im < 6; im++) {
            if (!ref_math_divisible(metric[im + 6 * node],
                                    total_node_volume[node]))
              RSS(REF_DIV_ZERO, "zero volume");
            log_m[im] = metric[im + 6 * node] / total_node_volume[node];
          }
          RSS(ref_matrix_exp_m(log_m, m), "exp");
          for (im = 0; im < 6; im++) metric[im + 6 * node] = m[im];
          total_node_volume[node] = 0.0;
          for (im = 0; im < 6; im++)
            RAS(isfinite(metric[im + 6 * node]), "infer not finite");
        } else {
          for (im = 0; im < 6; im++)
            metric[im + 6 * node] = backup[im + 6 * node];
          for (im = 0; im < 6; im++)
            RAS(isfinite(metric[im + 6 * node]), "backup not finite");
        }
      }
    } else {
      for (im = 0; im < 6; im++)
        RAS(isfinite(metric[im + 6 * node]), "orig,tet not finite");
    }
  }

  ref_free(total_node_volume);
  ref_free(backup);

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "update ghosts");

  return REF_SUCCESS;
}